

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<4,_7,_7>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float fVar1;
  long lVar2;
  float afStack_b8 [4];
  Type in1;
  Type in0;
  Matrix<float,_4,_2> local_5c;
  MatrixCaseUtils local_3c [12];
  VecAccess<float,_4,_3> local_30;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    afStack_b8[2] = 8.347504e-39;
    afStack_b8[3] = 0.0;
    tcu::Matrix<float,_4,_2>::Matrix(&in0);
    in0.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    in0.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    in0.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    in0.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
  }
  else {
    afStack_b8[2] = 8.347555e-39;
    afStack_b8[3] = 0.0;
    tcu::Matrix<float,_4,_2>::Matrix(&in0,(float *)sr::(anonymous_namespace)::s_constInMat2x4);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    afStack_b8[2] = 8.347577e-39;
    afStack_b8[3] = 0.0;
    tcu::Matrix<float,_4,_2>::Matrix(&in1);
    in1.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    in1.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    in1.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    in1.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
  }
  else {
    afStack_b8[2] = 8.347625e-39;
    afStack_b8[3] = 0.0;
    tcu::Matrix<float,_4,_2>::Matrix
              (&in1,(float *)(sr::(anonymous_namespace)::s_constInMat2x4 + 0x20));
  }
  afStack_b8[2] = 8.347639e-39;
  afStack_b8[3] = 0.0;
  tcu::Matrix<float,_4,_2>::Matrix(&local_5c);
  for (lVar2 = 4; lVar2 != 8; lVar2 = lVar2 + 1) {
    fVar1 = in0.m_data.m_data[0].m_data[lVar2];
    in0.m_data.m_data[1].m_data[lVar2 + 3] = in1.m_data.m_data[1].m_data[lVar2] * afStack_b8[lVar2];
    local_5c.m_data.m_data[0].m_data[lVar2] = fVar1 * in1.m_data.m_data[0].m_data[lVar2];
  }
  afStack_b8[2] = 8.347733e-39;
  afStack_b8[3] = 0.0;
  reduceToVec3(local_3c,&local_5c);
  local_30.m_vector = &evalCtx->color;
  local_30.m_index[0] = 0;
  local_30.m_index[1] = 1;
  local_30.m_index[2] = 2;
  afStack_b8[2] = 8.347794e-39;
  afStack_b8[3] = 0.0;
  tcu::VecAccess<float,_4,_3>::operator=(&local_30,(Vector<float,_3> *)local_3c);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(matrixCompMult(in0, in1));
	}